

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::showHelp(CommandParser *parser)

{
  OptionParser *this;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  pointer pPVar4;
  bool bVar5;
  Command local_150;
  AllOptions options;
  string exeName;
  string local_e0;
  string local_c0;
  string local_a0;
  HelpOptionParser helpOpt;
  string local_50;
  
  CommandParser::exeName_abi_cxx11_(&exeName,parser);
  lVar2 = std::__cxx11::string::find_last_of((char *)&exeName,0x18c35d);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_150,(ulong)&exeName);
    std::__cxx11::string::operator=((string *)&exeName,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
  }
  AllOptions::AllOptions(&options);
  Options::HelpOptionParser::HelpOptionParser(&helpOpt);
  bVar5 = false;
  for (pPVar4 = options.m_parsers.
                super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar4 != options.m_parsers.
                super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pPVar4 = pPVar4 + 1) {
    this = pPVar4->m_p;
    OptionParser::find(&local_150,this,parser);
    if ((local_150.m_name._M_string_length == 0) &&
       (local_150.m_args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_150.m_args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      Command::~Command(&local_150);
    }
    else {
      OptionParser::optionNames_abi_cxx11_(&local_a0,this);
      OptionParser::optionNames_abi_cxx11_(&local_50,&helpOpt.super_OptionParser);
      bVar1 = std::operator!=(&local_a0,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_a0);
      Command::~Command(&local_150);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\n");
        OptionParser::optionNames_abi_cxx11_(&local_150.m_name,this);
        poVar3 = std::operator<<(poVar3,(string *)&local_150);
        poVar3 = std::operator<<(poVar3," ");
        (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
          [5])(&local_a0,this);
        poVar3 = std::operator<<(poVar3,(string *)&local_a0);
        poVar3 = std::operator<<(poVar3,"\n\n");
        (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
          [6])(&local_50,this);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        poVar3 = std::operator<<(poVar3,"\n\n");
        (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
          [7])(&local_e0,this);
        addLineBreaks(&local_c0,&local_e0,0x50,2);
        poVar3 = std::operator<<(poVar3,(string *)&local_c0);
        poVar3 = std::operator<<(poVar3,"\n");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_150);
        bVar5 = true;
      }
    }
  }
  if (!bVar5) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&exeName);
    std::operator<<(poVar3," is a CATCH host application. Options are as follows:\n\n");
    showUsage((ostream *)&std::cout);
  }
  OptionParser::~OptionParser(&helpOpt.super_OptionParser);
  std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>::
  ~vector(&options.m_parsers);
  std::__cxx11::string::~string((string *)&exeName);
  return;
}

Assistant:

inline void showHelp( const CommandParser& parser ) {
        std::string exeName = parser.exeName();
        std::string::size_type pos = exeName.find_last_of( "/\\" );
        if( pos != std::string::npos ) {
            exeName = exeName.substr( pos+1 );
        }

        AllOptions options;
        Options::HelpOptionParser helpOpt;
        bool displayedSpecificOption = false;
        for( AllOptions::const_iterator it = options.begin(); it != options.end(); ++it ) {
            OptionParser& opt = **it;
            if( opt.find( parser ) && opt.optionNames() != helpOpt.optionNames() ) {
                displayedSpecificOption = true;
                std::cout   << "\n" << opt.optionNames() << " " << opt.argsSynopsis() << "\n\n"
                            << opt.optionSummary() << "\n\n"

                << addLineBreaks( opt.optionDescription(), 80, 2 ) << "\n" << std::endl;
            }
        }

        if( !displayedSpecificOption ) {
            std::cout << exeName << " is a CATCH host application. Options are as follows:\n\n";
            showUsage( std::cout );
        }
    }